

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall
fasttext::FastText::supervised
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line,
          vector<int,_std::allocator<int>_> *labels)

{
  result_type_conflict1 targetIndex;
  ulong uVar1;
  uniform_int_distribution<int> uniform;
  uniform_int_distribution<int> local_28;
  
  uVar1 = (long)(labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar1 != 0) &&
     ((line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
     )) {
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->loss
        == ova) {
      Model::update((this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,line,labels,-1,lr,state);
      return;
    }
    local_28._M_param._M_b = (int)(uVar1 >> 2) + -1;
    local_28._M_param._M_a = 0;
    targetIndex = std::uniform_int_distribution<int>::operator()
                            (&local_28,&state->rng,&local_28._M_param);
    Model::update((this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,line,labels,targetIndex,lr,state);
  }
  return;
}

Assistant:

void FastText::supervised(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line,
    const std::vector<int32_t>& labels) {
  if (labels.size() == 0 || line.size() == 0) {
    return;
  }
  if (args_->loss == loss_name::ova) {
    model_->update(line, labels, Model::kAllLabelsAsTarget, lr, state);
  } else {
    std::uniform_int_distribution<> uniform(0, labels.size() - 1);
    int32_t i = uniform(state.rng);
    model_->update(line, labels, i, lr, state);
  }
}